

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TransitionModelDiscrete.cpp
# Opt level: O0

Index __thiscall
TransitionModelDiscrete::SampleSuccessorState
          (TransitionModelDiscrete *this,Index state,Index action)

{
  int iVar1;
  undefined4 in_EDX;
  undefined4 in_ESI;
  long *in_RDI;
  double dVar2;
  int i;
  Index sucState;
  double sum;
  double randNr;
  Index local_28;
  double local_20;
  
  iVar1 = rand();
  local_20 = 0.0;
  local_28 = 0;
  while( true ) {
    if ((int)in_RDI[1] <= (int)local_28) {
      return 0;
    }
    dVar2 = (double)(**(code **)(*in_RDI + 0x20))(in_RDI,in_ESI,in_EDX,local_28);
    local_20 = dVar2 + local_20;
    if ((double)iVar1 / 2147483648.0 <= local_20) break;
    local_28 = local_28 + 1;
  }
  return local_28;
}

Assistant:

Index TransitionModelDiscrete::SampleSuccessorState(Index state, Index action)
{
    double randNr=rand() / (RAND_MAX + 1.0);

    double sum=0;
    Index sucState=0;
    int i;

    for(i=0;i<_m_nrStates;i++)
    {
        sum+=Get(state,action,i);
        if(randNr<=sum)
        {
            sucState=i;
            break;
        }
    }
    return(sucState);
}